

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_raise_exception(TCGContext_conflict2 *tcg_ctx,int nr)

{
  TCGv_i32 arg2;
  TCGv_i32 tmp;
  int nr_local;
  TCGContext_conflict2 *tcg_ctx_local;
  
  arg2 = tcg_const_i32_m68k(tcg_ctx,nr);
  gen_helper_raise_exception_m68k(tcg_ctx,tcg_ctx->cpu_env,arg2);
  tcg_temp_free_i32(tcg_ctx,arg2);
  return;
}

Assistant:

static void gen_raise_exception(TCGContext *tcg_ctx, int nr)
{
    TCGv_i32 tmp;

    tmp = tcg_const_i32(tcg_ctx, nr);
    gen_helper_raise_exception(tcg_ctx, tcg_ctx->cpu_env, tmp);
    tcg_temp_free_i32(tcg_ctx, tmp);
}